

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

csubstr * __thiscall c4::yml::Tree::key(Tree *this,size_t node)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  csubstr *pcVar5;
  csubstr cVar6;
  char *pcStack_20;
  
  pNVar4 = _p(this,node);
  if (((pNVar4->m_type).type & KEY) == NOTYPE) {
    eVar3 = get_error_flags();
    if ((eVar3 & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        pcVar5 = (csubstr *)(*pcVar1)();
        return pcVar5;
      }
    }
    cVar6 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    pcStack_20 = cVar6.str;
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4bbe) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4bbe) << 0x40,8);
    loc.name.str = pcStack_20;
    loc.name.len = cVar6.len;
    error("check failed: has_key(node)",0x1b,loc);
  }
  pNVar4 = _p(this,node);
  return &(pNVar4->m_key).scalar;
}

Assistant:

csubstr    const& key       (size_t node) const { RYML_ASSERT(has_key(node)); return _p(node)->m_key.scalar; }